

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::predict_or_learn_first<true>(cb_explore *data,single_learner *base,example *ec)

{
  float *pfVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t i;
  uint uVar4;
  uint uVar5;
  action_scores probs;
  action_score local_60;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_58._begin = (ec->pred).a_s._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  pfVar1 = &((ec->l).cs.costs._begin)->partial_prediction;
  if (1.0 < *pfVar1 || *pfVar1 == 1.0) {
    LEARNER::learner<char,_example>::predict(base,ec,0);
  }
  else {
    LEARNER::learner<char,_example>::learn(base,ec,0);
  }
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  if (data->tau == 0) {
    uVar2 = (ec->pred).multiclass;
    for (uVar5 = 0; uVar5 < (data->cbcs).num_actions; uVar5 = uVar5 + 1) {
      local_60.score = 0.0;
      local_60.action = uVar5;
      v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_60);
    }
    local_58._begin[uVar2 - 1].score = 1.0;
  }
  else {
    uVar5 = (data->cbcs).num_actions;
    uVar3 = (ulong)uVar5;
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      local_60.action = uVar4;
      local_60.score = 1.0 / (float)uVar3;
      v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_60);
      uVar5 = (data->cbcs).num_actions;
    }
    data->tau = data->tau - 1;
  }
  (ec->pred).scalars.end_array = (float *)local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).a_s._begin = local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_first(cb_explore& data, single_learner& base, example& ec)
{
  // Explore tau times, then act according to optimal.
  action_scores probs = ec.pred.a_s;

  if (is_learn && ec.l.cb.costs[0].probability < 1)
    base.learn(ec);
  else
    base.predict(ec);

  probs.clear();
  if (data.tau > 0)
  {
    float prob = 1.f / (float)data.cbcs.num_actions;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, prob});
    data.tau--;
  }
  else
  {
    uint32_t chosen = ec.pred.multiclass - 1;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
    probs[chosen].score = 1.0;
  }

  ec.pred.a_s = probs;
}